

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O0

int max_index(int *a,int n)

{
  int i;
  int j;
  int m;
  int n_local;
  int *a_local;
  
  m = -1;
  j = -1;
  for (i = 0; i < n; i = i + 1) {
    if (m < a[i]) {
      m = a[i];
      j = i;
    }
  }
  return j;
}

Assistant:

int max_index(const int *a, int n) {
  int m = -1;
  int j = -1;
  for (int i = 0; i < n; i++) {
	if (a[i] > m) {
	  m = a[i];
	  j = i;
	}
  }
  return j;
}